

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timsort.h
# Opt level: O2

void libxml_domnode_tim_sort_merge
               (xmlNodePtr *dst,TIM_SORT_RUN_T *stack,int stack_curr,TEMP_STORAGE_T *store)

{
  xmlNodePtr *ppxVar1;
  xmlNodePtr pxVar2;
  xmlNodePtr pxVar3;
  int iVar4;
  long lVar5;
  xmlNodePtr *__ptr;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  lVar5 = (long)stack_curr;
  uVar8 = stack[lVar5 + -2].length;
  uVar6 = stack[lVar5 + -1].length;
  uVar10 = uVar6;
  if (uVar8 < uVar6) {
    uVar10 = uVar8;
  }
  uVar9 = stack[lVar5 + -2].start;
  __ptr = store->storage;
  if (store->alloc < uVar10) {
    __ptr = (xmlNodePtr *)realloc(__ptr,uVar10 * 8);
    if (__ptr == (xmlNodePtr *)0x0) {
      fprintf(_stderr,"Error allocating temporary storage for tim sort: need %lu bytes",uVar10 * 8);
      exit(1);
    }
    store->storage = __ptr;
    store->alloc = uVar10;
  }
  if (uVar8 < uVar6) {
    memcpy(__ptr,dst + uVar9,uVar8 * 8);
    uVar10 = uVar9 + uVar8;
    uVar6 = uVar6 + uVar10;
    uVar7 = 0;
    do {
      if (uVar6 <= uVar9) {
        return;
      }
      if ((uVar7 < uVar8) && (uVar10 < uVar6)) {
        pxVar2 = __ptr[uVar7];
        pxVar3 = dst[uVar10];
        iVar4 = wrap_cmp(pxVar2,pxVar3);
        if (iVar4 < 1) {
          uVar7 = uVar7 + 1;
          dst[uVar9] = pxVar2;
        }
        else {
          uVar10 = uVar10 + 1;
          dst[uVar9] = pxVar3;
        }
      }
      else {
        if (uVar8 <= uVar7) {
          return;
        }
        ppxVar1 = __ptr + uVar7;
        uVar7 = uVar7 + 1;
        dst[uVar9] = *ppxVar1;
      }
      uVar9 = uVar9 + 1;
    } while( true );
  }
  uVar8 = uVar8 + uVar9;
  memcpy(__ptr,dst + uVar8,uVar6 * 8);
  uVar10 = uVar6 + uVar8;
  do {
    while( true ) {
      if (uVar10 <= uVar9) {
        return;
      }
      if ((uVar6 != 0) && (uVar9 < uVar8)) break;
      if (uVar6 == 0) {
        return;
      }
      dst[uVar10 - 1] = __ptr[uVar6 - 1];
LAB_001dad76:
      uVar6 = uVar6 - 1;
      uVar10 = uVar10 - 1;
    }
    pxVar2 = dst[uVar8 - 1];
    pxVar3 = __ptr[uVar6 - 1];
    iVar4 = wrap_cmp(pxVar2,pxVar3);
    if (iVar4 < 1) {
      dst[uVar10 - 1] = pxVar3;
      goto LAB_001dad76;
    }
    uVar8 = uVar8 - 1;
    dst[uVar10 - 1] = pxVar2;
    uVar10 = uVar10 - 1;
  } while( true );
}

Assistant:

static void TIM_SORT_MERGE(SORT_TYPE *dst, const TIM_SORT_RUN_T *stack, const int stack_curr,
                           TEMP_STORAGE_T *store) {
  const size_t A = stack[stack_curr - 2].length;
  const size_t B = stack[stack_curr - 1].length;
  const size_t curr = stack[stack_curr - 2].start;
  SORT_TYPE *storage;
  size_t i, j, k;
  TIM_SORT_RESIZE(store, MIN(A, B));
  storage = store->storage;

  /* left merge */
  if (A < B) {
    memcpy(storage, &dst[curr], A * sizeof(SORT_TYPE));
    i = 0;
    j = curr + A;

    for (k = curr; k < curr + A + B; k++) {
      if ((i < A) && (j < curr + A + B)) {
        if (SORT_CMP(storage[i], dst[j]) <= 0) {
          dst[k] = storage[i++];
        } else {
          dst[k] = dst[j++];
        }
      } else if (i < A) {
        dst[k] = storage[i++];
      } else {
        break;
      }
    }
  } else {
    /* right merge */
    memcpy(storage, &dst[curr + A], B * sizeof(SORT_TYPE));
    i = B;
    j = curr + A;
    k = curr + A + B;

    while (k > curr) {
      k--;
      if ((i > 0) && (j > curr)) {
        if (SORT_CMP(dst[j - 1], storage[i - 1]) > 0) {
          dst[k] = dst[--j];
        } else {
          dst[k] = storage[--i];
        }
      } else if (i > 0) {
        dst[k] = storage[--i];
      } else {
        break;
      }
    }
  }
}